

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens)

{
  char *pcVar1;
  long in_RDX;
  int in_ESI;
  int i;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *in_stack_00000130;
  string *in_stack_00000138;
  Parser *in_stack_00000140;
  allocator local_49;
  string local_48 [36];
  int local_24;
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  for (local_24 = 1; local_24 < local_c; local_24 = local_24 + 1) {
    pcVar1 = *(char **)(local_18 + (long)local_24 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    parseIntoTokens(in_stack_00000140,in_stack_00000138,in_stack_00000130);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            for( int i = 1; i < argc; ++i )
                parseIntoTokens( argv[i] , tokens);
        }